

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  unsigned_short local_16;
  uint local_14;
  ImGuiIO *pIStack_10;
  uint c_local;
  ImGuiIO *this_local;
  
  if ((c != 0) && (c < 0x10000)) {
    local_16 = (unsigned_short)c;
    local_14 = c;
    pIStack_10 = this;
    ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_16);
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    if (c > 0 && c <= IM_UNICODE_CODEPOINT_MAX)
        InputQueueCharacters.push_back((ImWchar)c);
}